

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool merlin::dominates(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *A,set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *B)

{
  bool bVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> temp;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  _Stack_38;
  
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,std::insert_iterator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((A->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(A->_M_t)._M_impl.super__Rb_tree_header,
             (B->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(B->_M_t)._M_impl.super__Rb_tree_header,&_Stack_38);
  bVar1 = std::operator==(&_Stack_38,&B->_M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&_Stack_38);
  return bVar1;
}

Assistant:

bool dominates(std::set<size_t>& A, std::set<size_t>& B) {
	std::set<size_t> temp;
	std::set_intersection(A.begin(), A.end(),
			B.begin(), B.end(),
			std::inserter(temp, temp.begin()));

	return (temp == B);
}